

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcStdin.c
# Opt level: O0

int Wlc_StdinProcessSmt(Abc_Frame_t *pAbc,char *pCmd)

{
  int iVar1;
  Vec_Str_t *pVVar2;
  char *pcVar3;
  char *pcVar4;
  Wlc_Ntk_t *pWVar5;
  void *pvVar6;
  Abc_Cex_t *pCex;
  char *pName;
  Wlc_Ntk_t *pNtk;
  Vec_Str_t *vInput;
  char *pCmd_local;
  Abc_Frame_t *pAbc_local;
  
  pVVar2 = Wlc_StdinCollectProblem("(check-sat)");
  pcVar3 = Vec_StrArray(pVVar2);
  pcVar4 = Vec_StrArray(pVVar2);
  iVar1 = Vec_StrSize(pVVar2);
  pWVar5 = Wlc_ReadSmtBuffer("top",pcVar3,pcVar4 + iVar1,0,0);
  Vec_StrFree(pVVar2);
  Wlc_SetNtk(pAbc,pWVar5);
  iVar1 = Cmd_CommandExecute(pAbc,pCmd);
  if (iVar1 == 0) {
    iVar1 = Abc_FrameReadProbStatus(pAbc);
    if (iVar1 == -1) {
      printf("undecided\n");
    }
    else {
      iVar1 = Abc_FrameReadProbStatus(pAbc);
      if (iVar1 == 1) {
        printf("unsat\n");
      }
      else {
        iVar1 = Abc_FrameReadProbStatus(pAbc);
        if (iVar1 != 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcStdin.c"
                        ,0xd4,"int Wlc_StdinProcessSmt(Abc_Frame_t *, char *)");
        }
        printf("sat\n");
      }
    }
    fflush(_stdout);
    while (pVVar2 = Wlc_StdinCollectQuery(), pVVar2 != (Vec_Str_t *)0x0) {
      pcVar3 = Vec_StrArray(pVVar2);
      pcVar3 = strtok(pcVar3," \n\t\r()");
      iVar1 = strcmp(pcVar3,"get-value");
      if (iVar1 != 0) {
        Abc_Print(1,
                  "ABC is expecting \"get-value\" in a follow-up input of the satisfiable problem.\n"
                 );
        Vec_StrFree(pVVar2);
        return 0;
      }
      iVar1 = Abc_FrameReadProbStatus(pAbc);
      if (iVar1 != 0) {
        Abc_Print(1,
                  "ABC received a follow-up input for a problem that is not known to be satisfiable.\n"
                 );
        Vec_StrFree(pVVar2);
        return 0;
      }
      pcVar3 = strtok((char *)0x0,"() \n\t\r");
      pvVar6 = Abc_FrameReadCex(pAbc);
      if (pvVar6 == (void *)0x0) {
        Abc_Print(1,
                  "ABC does not have a counter-example available to process a \"get-value\" request.\n"
                 );
        Vec_StrFree(pVVar2);
        return 0;
      }
      pWVar5 = (Wlc_Ntk_t *)pAbc->pAbcWlc;
      pCex = (Abc_Cex_t *)Abc_FrameReadCex(pAbc);
      Wlc_NtkReport(pWVar5,pCex,pcVar3,0x10);
      Vec_StrFree(pVVar2);
      fflush(_stdout);
    }
    pAbc_local._4_4_ = 1;
  }
  else {
    Abc_Print(1,"Something did not work out with the command \"%s\".\n",pCmd);
    pAbc_local._4_4_ = 0;
  }
  return pAbc_local._4_4_;
}

Assistant:

int Wlc_StdinProcessSmt( Abc_Frame_t * pAbc, char * pCmd )
{
    // collect stdin until (check-sat)
    Vec_Str_t * vInput = Wlc_StdinCollectProblem( "(check-sat)" );
    // parse input
    Wlc_Ntk_t * pNtk = Wlc_ReadSmtBuffer( "top", Vec_StrArray(vInput), Vec_StrArray(vInput) + Vec_StrSize(vInput), 0, 0 );
    Vec_StrFree( vInput );
    // install current network
    Wlc_SetNtk( pAbc, pNtk );
    // execute command
    if ( Cmd_CommandExecute(pAbc, pCmd) )
    {
        Abc_Print( 1, "Something did not work out with the command \"%s\".\n", pCmd );
        return 0;
    }
    // solver finished
    if ( Abc_FrameReadProbStatus(pAbc) == -1 )
        printf( "undecided\n" );
    else if ( Abc_FrameReadProbStatus(pAbc) == 1 )
        printf( "unsat\n" );
    else if ( Abc_FrameReadProbStatus(pAbc) == 0 )
        printf( "sat\n" );
    else assert( 0 );
    fflush( stdout );
    // wait for stdin for give directions
    while ( (vInput = Wlc_StdinCollectQuery()) != NULL )
    {
        char * pName = strtok( Vec_StrArray(vInput), " \n\t\r()" );
        // check directive 
        if ( strcmp(pName, "get-value") )
        {
            Abc_Print( 1, "ABC is expecting \"get-value\" in a follow-up input of the satisfiable problem.\n" );
            Vec_StrFree( vInput );
            return 0;
        }
        // check status
        if ( Abc_FrameReadProbStatus(pAbc) != 0 )
        {
            Abc_Print( 1, "ABC received a follow-up input for a problem that is not known to be satisfiable.\n" );
            Vec_StrFree( vInput );
            return 0;
        }
        // get the variable number
        pName = strtok( NULL, "() \n\t\r" );
        // get the counter-example
        if ( Abc_FrameReadCex(pAbc) == NULL )
        {
            Abc_Print( 1, "ABC does not have a counter-example available to process a \"get-value\" request.\n" );
            Vec_StrFree( vInput );
            return 0;
        }
        // report value of this variable
        Wlc_NtkReport( (Wlc_Ntk_t *)pAbc->pAbcWlc, (Abc_Cex_t *)Abc_FrameReadCex(pAbc), pName, 16 );
        Vec_StrFree( vInput );
        fflush( stdout );
    }
    return 1;
}